

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_transaction_context.cpp
# Opt level: O0

void __thiscall
TransactionContext_SequenceApiTestWithScript_Test::TestBody
          (TransactionContext_SequenceApiTestWithScript_Test *this)

{
  initializer_list<cfd::core::Pubkey> __l;
  initializer_list<cfd::core::Privkey> __l_00;
  initializer_list<cfd::UtxoData> __l_01;
  initializer_list<cfd::SignParameter> __l_02;
  bool bVar1;
  reference pvVar2;
  char *pcVar3;
  Amount AVar4;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> signatures;
  SignParameter sign1;
  SignParameter sign2;
  ByteData signature1;
  ByteData signature2;
  ByteData256 sighash;
  SigHashType sighash_type;
  OutPoint outpoint2;
  CfdException *anon_var_0_1;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  CfdException *anon_var_0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  OutPoint outpoint1;
  ByteData tx;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  TransactionContext txc;
  Address address2;
  Address address;
  UtxoData utxo3;
  UtxoData utxo2;
  vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> privkeys;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> pubkeys;
  UtxoData utxo1;
  AddressFactory factory;
  ulong in_stack_ffffffffffffcec8;
  Pubkey *pubkey;
  UtxoData *in_stack_ffffffffffffced0;
  TransactionContext *in_stack_ffffffffffffced8;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *in_stack_ffffffffffffcee0;
  undefined7 in_stack_ffffffffffffcee8;
  undefined1 in_stack_ffffffffffffceef;
  undefined7 in_stack_ffffffffffffcef8;
  undefined1 in_stack_ffffffffffffceff;
  TransactionContext *in_stack_ffffffffffffcf00;
  Script *in_stack_ffffffffffffcf08;
  undefined7 in_stack_ffffffffffffcf10;
  undefined1 in_stack_ffffffffffffcf17;
  OutPoint *in_stack_ffffffffffffcf18;
  undefined2 in_stack_ffffffffffffcf20;
  undefined1 in_stack_ffffffffffffcf22;
  undefined1 in_stack_ffffffffffffcf23;
  undefined1 in_stack_ffffffffffffcf24;
  undefined1 in_stack_ffffffffffffcf25;
  undefined1 in_stack_ffffffffffffcf26;
  undefined1 in_stack_ffffffffffffcf27;
  UtxoData *in_stack_ffffffffffffcf30;
  UtxoData *in_stack_ffffffffffffcf38;
  UtxoData *in_stack_ffffffffffffcf40;
  Address *in_stack_ffffffffffffcf48;
  undefined6 in_stack_ffffffffffffcf50;
  undefined1 in_stack_ffffffffffffcf56;
  undefined1 in_stack_ffffffffffffcf57;
  Amount *in_stack_ffffffffffffcf58;
  undefined8 ****ppppuVar5;
  SigHashType *in_stack_ffffffffffffcf60;
  undefined8 ****ppppuVar6;
  Script *in_stack_ffffffffffffcf68;
  OutPoint *in_stack_ffffffffffffcf70;
  TransactionContext *this_00;
  SignParameter *in_stack_ffffffffffffcf88;
  SignParameter *in_stack_ffffffffffffcf90;
  undefined8 ****local_2fd0;
  Privkey *local_2f88;
  Pubkey *local_2f40;
  AssertHelper local_2ee8;
  Message local_2ee0;
  string local_2ed8;
  AssertionResult local_2eb8;
  AssertHelper local_2ea8;
  Message local_2ea0;
  int64_t local_2e98;
  int64_t local_2e90;
  undefined1 local_2e88;
  Amount local_2e80;
  int64_t local_2e70;
  AssertionResult local_2e68;
  AssertHelper local_2e58;
  Message local_2e50 [4];
  AssertHelper local_2e30;
  Message local_2e28;
  AssertHelper local_2e20;
  Message local_2e18;
  OutPoint local_2e10;
  AssertHelper local_2de8;
  Message local_2de0 [2];
  undefined1 ****local_2dd0;
  undefined8 ***local_2dc8 [15];
  undefined1 local_2d50 [120];
  undefined1 ****local_2cd8;
  undefined8 local_2cd0;
  SigHashType local_2cac [11];
  SigHashType local_2c24 [11];
  ByteData local_2ba0;
  undefined1 in_stack_ffffffffffffd48f;
  SigHashType *in_stack_ffffffffffffd490;
  Privkey *in_stack_ffffffffffffd498;
  Pubkey *in_stack_ffffffffffffd4a0;
  OutPoint *in_stack_ffffffffffffd4a8;
  TransactionContext *in_stack_ffffffffffffd4b0;
  ByteData256 *in_stack_ffffffffffffd4c0;
  ByteData *in_stack_ffffffffffffd4c8;
  SigHashType local_2b2c;
  OutPoint local_2b20;
  AssertHelper local_2af8;
  Message local_2af0;
  AssertHelper local_2ae8;
  Message local_2ae0 [2];
  byte local_2ac9;
  ConstCharPtr local_2ac8;
  AssertHelper local_2ac0;
  Message local_2ab8 [3];
  TransactionContext *in_stack_ffffffffffffd560;
  string local_2a98;
  Privkey local_2a78;
  undefined1 local_2a51 [65];
  ConstCharPtr local_2a10;
  OutPoint local_2a08;
  ByteData local_29e0;
  AssertHelper local_29c8;
  Message local_29c0 [2];
  undefined1 ****local_29b0;
  undefined8 ***local_29a8 [136];
  OutPoint *in_stack_ffffffffffffda98;
  TransactionContext *in_stack_ffffffffffffdaa0;
  undefined1 local_24b8 [1264];
  undefined1 local_1fc8 [1264];
  undefined1 ****local_1ad8;
  undefined8 local_1ad0;
  allocator local_19f1;
  string local_19f0;
  Address local_19d0;
  allocator local_1851;
  string local_1850;
  Address local_1830;
  Amount local_16b8;
  allocator local_16a1;
  string local_16a0;
  Script local_1680;
  allocator local_1641;
  string local_1640;
  Txid local_1620;
  undefined8 local_1600;
  Txid local_15d8;
  uint32_t local_15b8;
  Script local_15b0 [8];
  string local_13c8 [32];
  Amount local_13a8;
  undefined4 local_1398;
  undefined8 local_1390;
  Amount local_1110;
  Script local_1100;
  Address local_10c8;
  Script local_f50;
  allocator local_f11;
  string local_f10;
  Txid local_ef0;
  undefined8 local_ed0;
  Txid local_ea8;
  uint32_t local_e88;
  Script local_e80;
  undefined1 local_e48 [432];
  string local_c98 [32];
  int64_t local_c78;
  undefined1 local_c70;
  undefined4 local_c68;
  undefined8 local_c60;
  undefined1 local_9da;
  allocator local_9d9;
  string local_9d8;
  allocator local_9b1;
  string local_9b0;
  allocator local_989;
  string local_988;
  Privkey *local_968;
  Privkey local_960;
  Privkey local_940;
  Privkey local_920;
  undefined1 local_900 [46];
  undefined1 local_8d2;
  allocator local_8d1;
  string local_8d0;
  allocator local_8a9;
  string local_8a8;
  allocator local_881;
  string local_880;
  Pubkey *local_860;
  Pubkey local_858;
  Pubkey local_840;
  Pubkey local_828;
  undefined1 local_810 [40];
  Amount local_7e8;
  allocator local_7d1;
  string local_7d0 [32];
  Address local_7b0;
  allocator local_631;
  string local_630;
  Script local_610;
  allocator local_5d1;
  string local_5d0;
  Script local_5b0;
  allocator local_571;
  string local_570;
  Txid local_550;
  undefined8 local_520;
  Txid local_4f8;
  uint32_t local_4d8;
  Script local_4d0;
  Script local_498;
  Address local_460;
  string local_2e8 [32];
  int64_t local_2c8;
  undefined1 local_2c0;
  undefined4 local_2b8;
  undefined8 local_2b0;
  
  cfd::AddressFactory::AddressFactory
            ((AddressFactory *)in_stack_ffffffffffffced0,
             (NetType)(in_stack_ffffffffffffcec8 >> 0x20));
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffcf30);
  local_520 = 0;
  local_2b0 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_570,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"
             ,&local_571);
  cfd::core::Txid::Txid(&local_550,&local_570);
  cfd::core::Txid::operator=(&local_4f8,&local_550);
  cfd::core::Txid::~Txid((Txid *)0x24a106);
  std::__cxx11::string::~string((string *)&local_570);
  std::allocator<char>::~allocator((allocator<char> *)&local_571);
  local_4d8 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5d0,
             "0020a8417024154c9283738a8216def5e28991d3ba3f6d6f8feaecb684321eab02fc",&local_5d1);
  cfd::core::Script::Script(&local_5b0,&local_5d0);
  cfd::core::Script::operator=(&local_4d0,&local_5b0);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffced0);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_630,
             "210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bac",&local_631);
  cfd::core::Script::Script(&local_610,&local_630);
  cfd::core::Script::operator=(&local_498,&local_610);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffced0);
  std::__cxx11::string::~string((string *)&local_630);
  std::allocator<char>::~allocator((allocator<char> *)&local_631);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_7d0,"bcrt1q4pqhqfq4fjfgxuu2sgtdaa0z3xga8w3ld4hcl6hvk6zry84tqt7qmyhh6w",&local_7d1
            );
  cfd::AddressFactory::GetAddress
            ((AddressFactory *)in_stack_ffffffffffffced8,(string *)in_stack_ffffffffffffced0);
  cfd::core::Address::operator=(&local_460,&local_7b0);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffced0);
  std::__cxx11::string::~string(local_7d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7d1);
  std::__cxx11::string::operator=
            (local_2e8,"wsh(pk(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b))"
            );
  cfd::core::Amount::Amount(&local_7e8,10000000);
  local_2c0 = local_7e8.ignore_check_;
  local_2c8 = local_7e8.amount_;
  local_2b8 = 3;
  local_8d2 = 1;
  local_860 = &local_858;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_880,
             "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27",&local_881);
  cfd::core::Pubkey::Pubkey(&local_858,&local_880);
  local_860 = &local_840;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_8a8,
             "020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281",&local_8a9);
  cfd::core::Pubkey::Pubkey(&local_840,&local_8a8);
  local_860 = &local_828;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_8d0,
             "03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae",&local_8d1);
  cfd::core::Pubkey::Pubkey(&local_828,&local_8d0);
  local_8d2 = 0;
  local_810._0_8_ = &local_858;
  local_810._8_8_ = (pointer)0x3;
  std::allocator<cfd::core::Pubkey>::allocator((allocator<cfd::core::Pubkey> *)0x24a47d);
  __l._M_len._0_7_ = in_stack_ffffffffffffcf10;
  __l._M_array = (iterator)in_stack_ffffffffffffcf08;
  __l._M_len._7_1_ = in_stack_ffffffffffffcf17;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
             in_stack_ffffffffffffcf00,__l,
             (allocator_type *)CONCAT17(in_stack_ffffffffffffceff,in_stack_ffffffffffffcef8));
  std::allocator<cfd::core::Pubkey>::~allocator((allocator<cfd::core::Pubkey> *)0x24a4b1);
  local_2f40 = (Pubkey *)local_810;
  do {
    local_2f40 = local_2f40 + -1;
    cfd::core::Pubkey::~Pubkey((Pubkey *)0x24a4e6);
  } while (local_2f40 != &local_858);
  std::__cxx11::string::~string((string *)&local_8d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8d1);
  std::__cxx11::string::~string((string *)&local_8a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8a9);
  std::__cxx11::string::~string((string *)&local_880);
  std::allocator<char>::~allocator((allocator<char> *)&local_881);
  local_9da = 1;
  local_968 = &local_960;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_988,"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP",&local_989)
  ;
  cfd::core::Privkey::FromWif(&local_960,&local_988,kTestnet,true);
  local_968 = &local_940;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_9b0,"cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt",&local_9b1)
  ;
  cfd::core::Privkey::FromWif(&local_940,&local_9b0,kTestnet,true);
  local_968 = &local_920;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_9d8,"cP3zjeHXgPnu3KJH4nLRbNSKbVnZgb92sPiC9ciJcsnWkubq2ny9",&local_9d9)
  ;
  cfd::core::Privkey::FromWif(&local_920,&local_9d8,kTestnet,true);
  local_9da = 0;
  local_900._0_8_ = &local_960;
  local_900._8_8_ = (pointer)0x3;
  std::allocator<cfd::core::Privkey>::allocator((allocator<cfd::core::Privkey> *)0x24a6c5);
  __l_00._M_len._0_7_ = in_stack_ffffffffffffcf10;
  __l_00._M_array = (iterator)in_stack_ffffffffffffcf08;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffcf17;
  std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::vector
            ((vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *)
             in_stack_ffffffffffffcf00,__l_00,
             (allocator_type *)CONCAT17(in_stack_ffffffffffffceff,in_stack_ffffffffffffcef8));
  std::allocator<cfd::core::Privkey>::~allocator((allocator<cfd::core::Privkey> *)0x24a6f9);
  local_2f88 = (Privkey *)local_900;
  do {
    local_2f88 = local_2f88 + -1;
    cfd::core::Privkey::~Privkey((Privkey *)0x24a72e);
  } while (local_2f88 != &local_960);
  std::__cxx11::string::~string((string *)&local_9d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9d9);
  std::__cxx11::string::~string((string *)&local_9b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9b1);
  std::__cxx11::string::~string((string *)&local_988);
  std::allocator<char>::~allocator((allocator<char> *)&local_989);
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffcf30);
  local_ed0 = 0;
  local_c60 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_f10,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3"
             ,&local_f11);
  cfd::core::Txid::Txid(&local_ef0,&local_f10);
  cfd::core::Txid::operator=(&local_ea8,&local_ef0);
  cfd::core::Txid::~Txid((Txid *)0x24a82e);
  std::__cxx11::string::~string((string *)&local_f10);
  std::allocator<char>::~allocator((allocator<char> *)&local_f11);
  local_e88 = 1;
  cfd::core::ScriptUtil::CreateMultisigRedeemScript
            (&local_f50,2,
             (vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)(local_810 + 0x10),
             true);
  cfd::core::Script::operator=((Script *)local_e48,&local_f50);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffced0);
  cfd::AddressFactory::CreateP2shAddress
            ((AddressFactory *)in_stack_ffffffffffffced8,(Script *)in_stack_ffffffffffffced0);
  cfd::core::Address::operator=((Address *)(local_e48 + 0x38),&local_10c8);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffced0);
  cfd::core::Address::GetLockingScript(&local_1100,(Address *)(local_e48 + 0x38));
  cfd::core::Script::operator=(&local_e80,&local_1100);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffced0);
  std::__cxx11::string::operator=
            (local_c98,
             "sh(wsh(multi(2,0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27,020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281,03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae)))"
            );
  cfd::core::Amount::Amount(&local_1110,180000);
  local_c70 = local_1110.ignore_check_;
  local_c78 = local_1110.amount_;
  local_c68 = 5;
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffcf30);
  local_1600 = 0;
  local_1390 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1640,
             "31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3",&local_1641);
  cfd::core::Txid::Txid(&local_1620,&local_1640);
  cfd::core::Txid::operator=(&local_15d8,&local_1620);
  cfd::core::Txid::~Txid((Txid *)0x24a9fe);
  std::__cxx11::string::~string((string *)&local_1640);
  std::allocator<char>::~allocator((allocator<char> *)&local_1641);
  local_15b8 = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_16a0,"51",&local_16a1);
  cfd::core::Script::Script(&local_1680,&local_16a0);
  cfd::core::Script::operator=(local_15b0,&local_1680);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffced0);
  std::__cxx11::string::~string((string *)&local_16a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_16a1);
  std::__cxx11::string::operator=(local_13c8,"raw(51)");
  cfd::core::Amount::Amount(&local_16b8,10000);
  local_13a8.ignore_check_ = local_16b8.ignore_check_;
  local_13a8.amount_ = local_16b8.amount_;
  local_1398 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1850,"mtmTFSnUTqGt6AaSqoRemj7ePPZ6YGXWeo",&local_1851);
  cfd::core::Address::Address(&local_1830,&local_1850);
  std::__cxx11::string::~string((string *)&local_1850);
  std::allocator<char>::~allocator((allocator<char> *)&local_1851);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_19f0,"bcrt1qg4nrukf07cf4slc0m4h8gq6v2guhzrw29sfnlu",&local_19f1);
  cfd::core::Address::Address(&local_19d0,&local_19f0);
  std::__cxx11::string::~string((string *)&local_19f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_19f1);
  cfd::TransactionContext::TransactionContext
            ((TransactionContext *)in_stack_ffffffffffffced0,
             (uint32_t)(in_stack_ffffffffffffcec8 >> 0x20),(uint32_t)in_stack_ffffffffffffcec8);
  local_29b0 = (undefined1 ****)local_29a8;
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffcf40,in_stack_ffffffffffffcf38);
  local_29b0 = (undefined1 ****)local_24b8;
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffcf40,in_stack_ffffffffffffcf38);
  local_29b0 = (undefined1 ****)local_1fc8;
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffcf40,in_stack_ffffffffffffcf38);
  local_1ad8 = (undefined1 ****)local_29a8;
  local_1ad0 = 3;
  std::allocator<cfd::UtxoData>::allocator((allocator<cfd::UtxoData> *)0x24ac6a);
  __l_01._M_len._0_7_ = in_stack_ffffffffffffcf10;
  __l_01._M_array = (iterator)in_stack_ffffffffffffcf08;
  __l_01._M_len._7_1_ = in_stack_ffffffffffffcf17;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_stack_ffffffffffffcf00,
             __l_01,(allocator_type *)CONCAT17(in_stack_ffffffffffffceff,in_stack_ffffffffffffcef8))
  ;
  std::allocator<cfd::UtxoData>::~allocator((allocator<cfd::UtxoData> *)0x24ac9e);
  local_2fd0 = &local_1ad8;
  do {
    local_2fd0 = local_2fd0 + -0x9e;
    cfd::UtxoData::~UtxoData(in_stack_ffffffffffffced0);
  } while (local_2fd0 != local_29a8);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::AddInputs
                (in_stack_ffffffffffffcf00,
                 (vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
                 CONCAT17(in_stack_ffffffffffffceff,in_stack_ffffffffffffcef8));
    }
  }
  else {
    testing::Message::Message(local_29c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_29c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_transaction_context.cpp"
               ,0x213,
               "Expected: txc.AddInputs(utxos) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_29c8,local_29c0);
    testing::internal::AssertHelper::~AssertHelper(&local_29c8);
    testing::Message::~Message((Message *)0x24b6fd);
  }
  cfd::TransactionContext::AddTxOut
            ((TransactionContext *)
             CONCAT17(in_stack_ffffffffffffcf57,
                      CONCAT16(in_stack_ffffffffffffcf56,in_stack_ffffffffffffcf50)),
             in_stack_ffffffffffffcf48,(Amount *)in_stack_ffffffffffffcf40);
  cfd::TransactionContext::AddTxOut
            ((TransactionContext *)
             CONCAT17(in_stack_ffffffffffffcf57,
                      CONCAT16(in_stack_ffffffffffffcf56,in_stack_ffffffffffffcf50)),
             in_stack_ffffffffffffcf48,(Amount *)in_stack_ffffffffffffcf40);
  cfd::core::ByteData::ByteData(&local_29e0);
  cfd::core::OutPoint::OutPoint(&local_2a08,&local_4f8,local_4d8);
  testing::internal::ConstCharPtr::ConstCharPtr(&local_2a10,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_2a10);
  if (bVar1) {
    local_2a51[0x40] = kSigHashDefault;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      in_stack_ffffffffffffcf90 = (SignParameter *)local_2a51;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)((long)local_2a51 + 1),
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b",
                 (allocator *)in_stack_ffffffffffffcf90);
      cfd::core::Pubkey::Pubkey
                ((Pubkey *)((long)local_2a51 + 0x21),(string *)((long)local_2a51 + 1));
      in_stack_ffffffffffffcf88 = (SignParameter *)&stack0xffffffffffffd567;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_2a98,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5",
                 (allocator *)in_stack_ffffffffffffcf88);
      cfd::core::Privkey::FromWif(&local_2a78,&local_2a98,kTestnet,true);
      cfd::core::SigHashType::SigHashType((SigHashType *)(local_2ab8 + 2));
      in_stack_ffffffffffffced0 = (UtxoData *)0x0;
      in_stack_ffffffffffffcec8 = 0;
      cfd::TransactionContext::SignWithKey
                (in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8,in_stack_ffffffffffffd4a0,
                 in_stack_ffffffffffffd498,in_stack_ffffffffffffd490,(bool)in_stack_ffffffffffffd48f
                 ,in_stack_ffffffffffffd4c0,in_stack_ffffffffffffd4c8);
      cfd::core::Privkey::~Privkey((Privkey *)0x24b913);
      std::__cxx11::string::~string((string *)&local_2a98);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffd567);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x24b93a);
      std::__cxx11::string::~string((string *)((long)local_2a51 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_2a51);
    }
    if ((local_2a51[0x40] & kSigHashAll) == kSigHashDefault) {
      local_2a10.value =
           "Expected: txc.SignWithKey(outpoint1, Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_0024baeb;
    }
  }
  else {
LAB_0024baeb:
    testing::Message::Message(local_2ab8);
    testing::internal::AssertHelper::AssertHelper
              (&local_2ac0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_transaction_context.cpp"
               ,0x21f,local_2a10.value);
    testing::internal::AssertHelper::operator=(&local_2ac0,local_2ab8);
    testing::internal::AssertHelper::~AssertHelper(&local_2ac0);
    testing::Message::~Message((Message *)0x24bb53);
  }
  testing::internal::ConstCharPtr::ConstCharPtr(&local_2ac8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_2ac8);
  if (bVar1) {
    local_2ac9 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::Verify(in_stack_ffffffffffffdaa0,in_stack_ffffffffffffda98);
    }
    if ((local_2ac9 & 1) != 0) goto LAB_0024bd6d;
    local_2ac8.value =
         "Expected: txc.Verify(outpoint1) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_2ae0);
  testing::internal::AssertHelper::AssertHelper
            (&local_2ae8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_transaction_context.cpp"
             ,0x221,local_2ac8.value);
  testing::internal::AssertHelper::operator=(&local_2ae8,local_2ae0);
  testing::internal::AssertHelper::~AssertHelper(&local_2ae8);
  testing::Message::~Message((Message *)0x24bd22);
LAB_0024bd6d:
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::IgnoreVerify
                (in_stack_ffffffffffffcf00,
                 (OutPoint *)CONCAT17(in_stack_ffffffffffffceff,in_stack_ffffffffffffcef8));
    }
  }
  else {
    testing::Message::Message(&local_2af0);
    testing::internal::AssertHelper::AssertHelper
              (&local_2af8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_transaction_context.cpp"
               ,0x222,
               "Expected: txc.IgnoreVerify(outpoint1) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_2af8,&local_2af0);
    testing::internal::AssertHelper::~AssertHelper(&local_2af8);
    testing::Message::~Message((Message *)0x24be61);
  }
  cfd::core::OutPoint::OutPoint(&local_2b20,&local_ea8,local_e88);
  cfd::core::SigHashType::SigHashType(&local_2b2c);
  this_00 = (TransactionContext *)local_e48;
  cfd::core::SigHashType::SigHashType((SigHashType *)&stack0xffffffffffffd494,&local_2b2c);
  pubkey = (Pubkey *)(in_stack_ffffffffffffcec8 & 0xffffffff00000000);
  cfd::TransactionContext::CreateSignatureHash
            (this_00,in_stack_ffffffffffffcf70,in_stack_ffffffffffffcf68,in_stack_ffffffffffffcf60,
             in_stack_ffffffffffffcf58,(WitnessVersion)in_stack_ffffffffffffcf90);
  cfd::core::ByteData256::ByteData256
            ((ByteData256 *)&stack0xffffffffffffd4b8,(ByteData *)&stack0xffffffffffffd4a0);
  cfd::core::ByteData::~ByteData((ByteData *)0x24bf64);
  pvVar2 = std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::operator[]
                     ((vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *)
                      (local_900 + 0x10),2);
  cfd::core::SignatureUtil::CalculateEcSignature
            ((ByteData *)&stack0xffffffffffffd478,(ByteData256 *)&stack0xffffffffffffd4b8,pvVar2,
             true);
  pvVar2 = std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::operator[]
                     ((vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *)
                      (local_900 + 0x10),1);
  cfd::core::SignatureUtil::CalculateEcSignature
            (&local_2ba0,(ByteData256 *)&stack0xffffffffffffd4b8,pvVar2,true);
  cfd::core::SigHashType::SigHashType(local_2c24,&local_2b2c);
  cfd::SignParameter::SignParameter
            ((SignParameter *)CONCAT17(in_stack_ffffffffffffcf17,in_stack_ffffffffffffcf10),
             (ByteData *)in_stack_ffffffffffffcf08,SUB81((ulong)in_stack_ffffffffffffcf00 >> 0x38,0)
             ,(SigHashType *)CONCAT17(in_stack_ffffffffffffceff,in_stack_ffffffffffffcef8));
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::operator[]
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)(local_810 + 0x10),2);
  cfd::SignParameter::SetRelatedPubkey((SignParameter *)in_stack_ffffffffffffced0,pubkey);
  cfd::core::SigHashType::SigHashType(local_2cac,&local_2b2c);
  cfd::SignParameter::SignParameter
            ((SignParameter *)CONCAT17(in_stack_ffffffffffffcf17,in_stack_ffffffffffffcf10),
             (ByteData *)in_stack_ffffffffffffcf08,SUB81((ulong)in_stack_ffffffffffffcf00 >> 0x38,0)
             ,(SigHashType *)CONCAT17(in_stack_ffffffffffffceff,in_stack_ffffffffffffcef8));
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::operator[]
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)(local_810 + 0x10),1);
  cfd::SignParameter::SetRelatedPubkey((SignParameter *)in_stack_ffffffffffffced0,pubkey);
  local_2dd0 = (undefined1 ****)local_2dc8;
  cfd::SignParameter::SignParameter(in_stack_ffffffffffffcf90,in_stack_ffffffffffffcf88);
  local_2dd0 = (undefined1 ****)local_2d50;
  cfd::SignParameter::SignParameter(in_stack_ffffffffffffcf90,in_stack_ffffffffffffcf88);
  local_2cd8 = (undefined1 ****)local_2dc8;
  local_2cd0 = 2;
  std::allocator<cfd::SignParameter>::allocator((allocator<cfd::SignParameter> *)0x24c0f3);
  __l_02._M_len._0_7_ = in_stack_ffffffffffffcf10;
  __l_02._M_array = (iterator)in_stack_ffffffffffffcf08;
  __l_02._M_len._7_1_ = in_stack_ffffffffffffcf17;
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::vector
            ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
             in_stack_ffffffffffffcf00,__l_02,
             (allocator_type *)CONCAT17(in_stack_ffffffffffffceff,in_stack_ffffffffffffcef8));
  std::allocator<cfd::SignParameter>::~allocator((allocator<cfd::SignParameter> *)0x24c127);
  ppppuVar6 = local_2dc8;
  ppppuVar5 = &local_2cd8;
  do {
    ppppuVar5 = ppppuVar5 + -0xf;
    cfd::SignParameter::~SignParameter((SignParameter *)in_stack_ffffffffffffced0);
  } while (ppppuVar5 != ppppuVar6);
  cfd::TransactionContext::AddMultisigSign
            ((TransactionContext *)
             CONCAT17(in_stack_ffffffffffffcf27,
                      CONCAT16(in_stack_ffffffffffffcf26,
                               CONCAT15(in_stack_ffffffffffffcf25,
                                        CONCAT14(in_stack_ffffffffffffcf24,
                                                 CONCAT13(in_stack_ffffffffffffcf23,
                                                          CONCAT12(in_stack_ffffffffffffcf22,
                                                                   in_stack_ffffffffffffcf20)))))),
             in_stack_ffffffffffffcf18,
             (vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
             CONCAT17(in_stack_ffffffffffffcf17,in_stack_ffffffffffffcf10),in_stack_ffffffffffffcf08
             ,(AddressType)((ulong)in_stack_ffffffffffffcf00 >> 0x20));
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::Verify(in_stack_ffffffffffffdaa0,in_stack_ffffffffffffda98);
    }
  }
  else {
    testing::Message::Message(local_2de0);
    testing::internal::AssertHelper::AssertHelper
              (&local_2de8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_transaction_context.cpp"
               ,0x232,
               "Expected: txc.Verify(outpoint2) doesn\'t throw an exception.\n  Actual: it throws.")
    ;
    testing::internal::AssertHelper::operator=(&local_2de8,local_2de0);
    testing::internal::AssertHelper::~AssertHelper(&local_2de8);
    testing::Message::~Message((Message *)0x24c447);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_2e10,&local_15d8,local_15b8);
      cfd::TransactionContext::Verify(in_stack_ffffffffffffdaa0,in_stack_ffffffffffffda98);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x24c504);
    }
  }
  else {
    testing::Message::Message(&local_2e18);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_transaction_context.cpp"
               ,0x235,
               "Expected: txc.Verify(OutPoint(utxo3.txid, utxo3.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_2e20,&local_2e18);
    testing::internal::AssertHelper::~AssertHelper(&local_2e20);
    testing::Message::~Message((Message *)0x24c5ce);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::Verify((TransactionContext *)in_stack_ffffffffffffcf30);
    }
  }
  else {
    testing::Message::Message(&local_2e28);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_transaction_context.cpp"
               ,0x237,"Expected: txc.Verify() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_2e30,&local_2e28);
    testing::internal::AssertHelper::~AssertHelper(&local_2e30);
    testing::Message::~Message((Message *)0x24c6f9);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::Finalize(in_stack_ffffffffffffced8);
      cfd::core::ByteData::operator=((ByteData *)in_stack_ffffffffffffced0,&pubkey->data_);
      cfd::core::ByteData::~ByteData((ByteData *)0x24c7aa);
    }
  }
  else {
    testing::Message::Message(local_2e50);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_transaction_context.cpp"
               ,0x239,
               "Expected: tx = txc.Finalize() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_2e58,local_2e50);
    testing::internal::AssertHelper::~AssertHelper(&local_2e58);
    testing::Message::~Message((Message *)0x24c851);
  }
  AVar4 = cfd::TransactionContext::GetFeeAmount(in_stack_ffffffffffffd560);
  local_2e90 = AVar4.amount_;
  local_2e88 = AVar4.ignore_check_;
  local_2e80.amount_ = local_2e90;
  local_2e80.ignore_check_ = (bool)local_2e88;
  local_2e70 = cfd::core::Amount::GetSatoshiValue(&local_2e80);
  local_2e98 = cfd::core::Amount::GetSatoshiValue(&local_13a8);
  testing::internal::EqHelper<false>::Compare<long,long>
            ((char *)CONCAT17(in_stack_ffffffffffffceef,in_stack_ffffffffffffcee8),
             (char *)in_stack_ffffffffffffcee0,(long *)in_stack_ffffffffffffced8,
             (long *)in_stack_ffffffffffffced0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2e68);
  if (!bVar1) {
    testing::Message::Message(&local_2ea0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x24c9b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_2ea8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_transaction_context.cpp"
               ,0x23a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2ea8,&local_2ea0);
    testing::internal::AssertHelper::~AssertHelper(&local_2ea8);
    testing::Message::~Message((Message *)0x24ca0d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x24ca65);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_2ed8,&local_29e0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_2eb8,"tx.GetHex().c_str()",
             "\"02000000000103a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b69291553101000000232200204c74fe8b7289c82e22bea07e45a4d8c911e770905176c2ed8d1fe005c8b49b2bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b6929155310200000000ffffffff0280969800000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac20bf02000000000016001445663e592ff613587f0fdd6e74034c5239710dca0004004730440220329d9b55274f5d77bf9115a07e6272b28945edd846d06656812faf7bb8bbed0f0220306969ce3aa41efa9cdef778d3c649ff196876c6314fe9c9c5daa5edf4b60d10014730440220266222c9508b6f8cd558c6c6327debef845406072939b26d157b2de9f859dfab0220718f2a192eace2ba7a17a1faebfdde067d24185adb470ba45d16bf9c57ce3ecb016952210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2721020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f22812103ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae53ae0000000000\""
             ,pcVar3,
             "02000000000103a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b69291553101000000232200204c74fe8b7289c82e22bea07e45a4d8c911e770905176c2ed8d1fe005c8b49b2bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b6929155310200000000ffffffff0280969800000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac20bf02000000000016001445663e592ff613587f0fdd6e74034c5239710dca0004004730440220329d9b55274f5d77bf9115a07e6272b28945edd846d06656812faf7bb8bbed0f0220306969ce3aa41efa9cdef778d3c649ff196876c6314fe9c9c5daa5edf4b60d10014730440220266222c9508b6f8cd558c6c6327debef845406072939b26d157b2de9f859dfab0220718f2a192eace2ba7a17a1faebfdde067d24185adb470ba45d16bf9c57ce3ecb016952210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2721020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f22812103ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae53ae0000000000"
            );
  std::__cxx11::string::~string((string *)&local_2ed8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2eb8);
  if (!bVar1) {
    testing::Message::Message(&local_2ee0);
    in_stack_ffffffffffffcee0 =
         (vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
         testing::AssertionResult::failure_message((AssertionResult *)0x24cb4c);
    testing::internal::AssertHelper::AssertHelper
              (&local_2ee8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_transaction_context.cpp"
               ,0x23b,(char *)in_stack_ffffffffffffcee0);
    testing::internal::AssertHelper::operator=(&local_2ee8,&local_2ee0);
    testing::internal::AssertHelper::~AssertHelper(&local_2ee8);
    testing::Message::~Message((Message *)0x24cba9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x24cc01);
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector
            (in_stack_ffffffffffffcee0);
  cfd::SignParameter::~SignParameter((SignParameter *)in_stack_ffffffffffffced0);
  cfd::SignParameter::~SignParameter((SignParameter *)in_stack_ffffffffffffced0);
  cfd::core::ByteData::~ByteData((ByteData *)0x24cc35);
  cfd::core::ByteData::~ByteData((ByteData *)0x24cc42);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)0x24cc4f);
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x24cc5c);
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x24cc69);
  cfd::core::ByteData::~ByteData((ByteData *)0x24cc76);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_stack_ffffffffffffcee0);
  cfd::TransactionContext::~TransactionContext((TransactionContext *)in_stack_ffffffffffffced0);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffced0);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffced0);
  cfd::UtxoData::~UtxoData(in_stack_ffffffffffffced0);
  cfd::UtxoData::~UtxoData(in_stack_ffffffffffffced0);
  std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::~vector
            ((vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *)
             in_stack_ffffffffffffcee0);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
             in_stack_ffffffffffffcee0);
  cfd::UtxoData::~UtxoData(in_stack_ffffffffffffced0);
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x24ccf8);
  return;
}

Assistant:

TEST(TransactionContext, SequenceApiTestWithScript)
{
  AddressFactory factory(NetType::kRegtest);
  // Address1 (p2wsh on p2pk)
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo1.vout = 0;
  utxo1.locking_script = Script("0020a8417024154c9283738a8216def5e28991d3ba3f6d6f8feaecb684321eab02fc");
  utxo1.redeem_script = Script("210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bac");
  utxo1.address = factory.GetAddress("bcrt1q4pqhqfq4fjfgxuu2sgtdaa0z3xga8w3ld4hcl6hvk6zry84tqt7qmyhh6w");
  utxo1.descriptor = "wsh(pk(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b))";
  utxo1.amount = Amount(int64_t{10000000});
  utxo1.address_type = AddressType::kP2wshAddress;

  // Address2 (2 of 3 multisig)
  // pubkey1: '0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27',
  // privkey1: 'cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP'
  // pubkey2: '020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281',
  // privkey2: 'cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt'
  // pubkey3: '03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae',
  // privkey3: 'cP3zjeHXgPnu3KJH4nLRbNSKbVnZgb92sPiC9ciJcsnWkubq2ny9'
  std::vector<Pubkey> pubkeys = {
    Pubkey("0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"),
    Pubkey("020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281"),
    Pubkey("03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae")
  };
  std::vector<Privkey> privkeys = {
    Privkey::FromWif("cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP", NetType::kTestnet),
    Privkey::FromWif("cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt", NetType::kTestnet),
    Privkey::FromWif("cP3zjeHXgPnu3KJH4nLRbNSKbVnZgb92sPiC9ciJcsnWkubq2ny9", NetType::kTestnet)
  };
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo2.vout = 1;
  utxo2.redeem_script = ScriptUtil::CreateMultisigRedeemScript(2, pubkeys);
  utxo2.address = factory.CreateP2shAddress(utxo2.redeem_script);
  utxo2.locking_script = utxo2.address.GetLockingScript();
  utxo2.descriptor = "sh(wsh(multi(2,0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27,020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281,03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae)))";
  utxo2.amount = Amount(int64_t{180000});
  utxo2.address_type = AddressType::kP2shP2wshAddress;

  // Address3 (OP_TRUE)
  UtxoData utxo3;
  utxo3.block_height = 0;
  utxo3.binary_data = nullptr;
  utxo3.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo3.vout = 2;
  utxo3.locking_script = Script("51");
  // utxo3.address;
  utxo3.descriptor = "raw(51)";
  utxo3.amount = Amount(int64_t{10000});
  utxo3.address_type = AddressType::kP2shAddress;

  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  Address address("mtmTFSnUTqGt6AaSqoRemj7ePPZ6YGXWeo");
  // "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"
  Address address2("bcrt1qg4nrukf07cf4slc0m4h8gq6v2guhzrw29sfnlu");

  TransactionContext txc(2, 0);
  std::vector<cfd::UtxoData> utxos{utxo1, utxo2, utxo3};

  EXPECT_NO_THROW(txc.AddInputs(utxos));
  txc.AddTxOut(address, utxo1.amount);
  txc.AddTxOut(address2, utxo2.amount);

  ByteData tx;

  // sign1 -> fail -> ignore
  OutPoint outpoint1(utxo1.txid, utxo1.vout);
  EXPECT_THROW(txc.SignWithKey(outpoint1,
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)),
      CfdException);

  EXPECT_THROW(txc.Verify(outpoint1), CfdException);
  EXPECT_NO_THROW(txc.IgnoreVerify(outpoint1));

  // sign2 -> manual -> success
  OutPoint outpoint2(utxo2.txid, utxo2.vout);
  SigHashType sighash_type;
  ByteData256 sighash = ByteData256(txc.CreateSignatureHash(outpoint2,
      utxo2.redeem_script, sighash_type, utxo2.amount, WitnessVersion::kVersion0));
  ByteData signature2 = SignatureUtil::CalculateEcSignature(sighash, privkeys[2]);
  ByteData signature1 = SignatureUtil::CalculateEcSignature(sighash, privkeys[1]);
  SignParameter sign2(signature2, true, sighash_type);
  sign2.SetRelatedPubkey(pubkeys[2]);
  SignParameter sign1(signature1, true, sighash_type);
  sign1.SetRelatedPubkey(pubkeys[1]);
  std::vector<SignParameter> signatures = {sign2, sign1};
  txc.AddMultisigSign(
      outpoint2, signatures, utxo2.redeem_script, utxo2.address_type);
  EXPECT_NO_THROW(txc.Verify(outpoint2));

  // sign3 -> ok
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo3.txid, utxo3.vout)));

  EXPECT_NO_THROW(txc.Verify());

  EXPECT_NO_THROW(tx = txc.Finalize());
  EXPECT_EQ(txc.GetFeeAmount().GetSatoshiValue(), utxo3.amount.GetSatoshiValue());
  EXPECT_STREQ(tx.GetHex().c_str(), "02000000000103a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b69291553101000000232200204c74fe8b7289c82e22bea07e45a4d8c911e770905176c2ed8d1fe005c8b49b2bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b6929155310200000000ffffffff0280969800000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac20bf02000000000016001445663e592ff613587f0fdd6e74034c5239710dca0004004730440220329d9b55274f5d77bf9115a07e6272b28945edd846d06656812faf7bb8bbed0f0220306969ce3aa41efa9cdef778d3c649ff196876c6314fe9c9c5daa5edf4b60d10014730440220266222c9508b6f8cd558c6c6327debef845406072939b26d157b2de9f859dfab0220718f2a192eace2ba7a17a1faebfdde067d24185adb470ba45d16bf9c57ce3ecb016952210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2721020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f22812103ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae53ae0000000000");
}